

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

void ON_SubDEdgeChain::ReverseEdgeChain(ON_SubDEdgePtr *edge_chain,size_t edge_count)

{
  ulong uVar1;
  ON_SubDEdgePtr *pOVar2;
  
  if (edge_chain != (ON_SubDEdgePtr *)0x0 && edge_count != 0) {
    pOVar2 = edge_chain + (edge_count - 1);
    if (edge_chain < pOVar2) {
      do {
        uVar1 = edge_chain->m_ptr;
        edge_chain->m_ptr = pOVar2->m_ptr & 0xfffffffffffffff9 ^ 1;
        pOVar2->m_ptr = uVar1 & 0xfffffffffffffff9 ^ 1;
        edge_chain = edge_chain + 1;
        pOVar2 = pOVar2 + -1;
      } while (edge_chain < pOVar2);
    }
    if (edge_chain == pOVar2) {
      edge_chain->m_ptr = edge_chain->m_ptr & 0xfffffffffffffff9 ^ 1;
      return;
    }
  }
  return;
}

Assistant:

void ON_SubDEdgeChain::ReverseEdgeChain(
  ON_SubDEdgePtr* edge_chain,
  size_t edge_count
  )
{
  if (edge_count <= 0 || nullptr == edge_chain)
    return;
  ON_SubDEdgePtr* p0 = edge_chain;
  ON_SubDEdgePtr* p1 = p0 + (edge_count - 1);
  while ( p0 < p1)
  {
    ON_SubDEdgePtr eptr = p0->Reversed();
    *p0 = p1->Reversed();
    *p1 = eptr;
    ++p0;
    --p1;
  }
  if (p0 == p1)
    *p0 = p0->Reversed();
}